

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O3

uint32_t address_space_ldub_cached_slow_sparc
                   (uc_struct_conflict8 *uc,MemoryRegionCache *cache,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result)

{
  MemTxResult MVar1;
  byte *pbVar2;
  AddressSpace **target_as_00;
  IOMMUMemoryRegion *iommu_mr;
  hwaddr addr1;
  hwaddr l;
  AddressSpace *target_as;
  uint64_t val;
  undefined1 local_70 [8];
  MemoryRegionSection local_68;
  
  if (cache->ptr == (void *)0x0) {
    target_as_00 = (AddressSpace **)(addr + cache->xlat);
    iommu_mr = (IOMMUMemoryRegion *)(cache->mrs).mr;
    if ((iommu_mr != (IOMMUMemoryRegion *)0x0) && ((iommu_mr->parent_obj).is_iommu != false)) {
      address_space_translate_iommu
                (&local_68,iommu_mr,(hwaddr *)&stack0xffffffffffffff80,
                 (hwaddr *)&stack0xffffffffffffff88,(hwaddr *)0x0,SUB81(local_70,0),attrs._0_1_,
                 target_as_00,(MemTxAttrs)0x1);
      iommu_mr = (IOMMUMemoryRegion *)local_68.mr;
    }
    if ((iommu_mr->parent_obj).ram == false) {
      MVar1 = memory_region_dispatch_read_sparc
                        (uc,&iommu_mr->parent_obj,(hwaddr)target_as_00,(uint64_t *)&local_68,MO_8,
                         attrs);
    }
    else {
      pbVar2 = (byte *)qemu_map_ram_ptr_sparc
                                 ((uc_struct_conflict8 *)(iommu_mr->parent_obj).uc,
                                  (iommu_mr->parent_obj).ram_block,(ram_addr_t)target_as_00);
      local_68.size._0_4_ = (uint)*pbVar2;
      MVar1 = 0;
    }
    if (result != (MemTxResult *)0x0) {
      *result = MVar1;
    }
    return (uint)local_68.size;
  }
  __assert_fail("!cache->ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x7b1,
                "MemoryRegion *address_space_translate_cached(MemoryRegionCache *, hwaddr, hwaddr *, hwaddr *, _Bool, MemTxAttrs)"
               );
}

Assistant:

uint32_t glue(address_space_ldub, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result)
{
    uint8_t *ptr;
    uint64_t val;
    MemoryRegion *mr;
    hwaddr l = 1;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, false, attrs);
    if (!memory_access_is_direct(mr, false)) {
        release_lock |= prepare_mmio_access(mr);

        /* I/O case */
        r = memory_region_dispatch_read(uc, mr, addr1, &val, MO_8, attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        val = ldub_p(ptr);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
    return val;
}